

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void quantize_row_q2_K_ref(float *x,block_q2_K *y,int64_t k)

{
  block_q2_K *pbVar1;
  float *pfVar2;
  byte bVar3;
  byte bVar7;
  char cVar11;
  ushort uVar13;
  ushort uVar14;
  short sVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  undefined1 auVar20 [12];
  short sVar21;
  undefined1 auVar22 [16];
  bool bVar23;
  bool bVar24;
  anon_union_4_2_5fd15f10 fp32_4;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ushort uVar28;
  anon_union_4_2_5fd15f10 fp32_1;
  long lVar29;
  float *pfVar30;
  uint8_t *puVar31;
  int j;
  block_q2_K *pbVar32;
  long lVar33;
  anon_union_4_2_5fd15f10 fp32;
  float fVar34;
  undefined1 auVar35 [16];
  anon_union_4_2_5fd15f10 fp32_3;
  float fVar36;
  undefined1 in_XMM1 [16];
  undefined1 auVar37 [16];
  ushort uVar38;
  anon_union_4_2_5fd15f10 fp32_2;
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  uint8_t Laux [16];
  float scales [16];
  float mins [16];
  float weights [16];
  uint8_t L [256];
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  char cVar12;
  
  lVar33 = k + 0xff;
  if (-1 < k) {
    lVar33 = k;
  }
  uVar25 = (uint)((ulong)lVar33 >> 8);
  if (0 < (int)uVar25) {
    uVar27 = 0;
    pbVar32 = y;
    do {
      pbVar1 = y + uVar27;
      lVar33 = 0;
      auVar40 = (undefined1  [16])0x0;
      pfVar30 = x;
      fVar39 = 0.0;
      do {
        lVar29 = 0;
        do {
          uVar26 = *(ulong *)(pfVar30 + lVar29 + 2);
          *(ulong *)(weights + lVar29) = *(ulong *)(pfVar30 + lVar29) & 0x7fffffff7fffffff;
          *(ulong *)(weights + lVar29 + 2) = uVar26 & 0x7fffffff7fffffff;
          lVar29 = lVar29 + 4;
        } while (lVar29 != 0x10);
        fVar34 = make_qkx2_quants(0x10,3,x + lVar33 * 0x10,weights,L + lVar33 * 0x10,mins + lVar33,
                                  Laux,-0.5,in_XMM1._0_4_,0xf,true);
        scales[lVar33] = fVar34;
        if (fVar34 <= fVar39) {
          fVar34 = fVar39;
        }
        fVar36 = mins[lVar33];
        if (fVar36 <= auVar40._0_4_) {
          fVar36 = auVar40._0_4_;
        }
        auVar20._4_8_ = 0;
        auVar20._0_4_ = fVar36;
        in_XMM1._12_4_ = 0;
        in_XMM1._0_12_ = auVar20;
        lVar33 = lVar33 + 1;
        pfVar30 = pfVar30 + 0x10;
        auVar40._12_4_ = 0;
        auVar40._0_12_ = auVar20;
        fVar39 = fVar34;
      } while (lVar33 != 0x10);
      if (fVar34 <= 0.0) {
        auVar35._0_12_ = ZEXT812(0);
        auVar35._12_4_ = 0;
        *(undefined1 (*) [16])pbVar1->scales = auVar35;
        uVar28 = 0;
      }
      else {
        fVar39 = 15.0 / fVar34;
        lVar33 = 0;
        do {
          fVar42 = scales[lVar33] * fVar39 + 12582912.0;
          fVar46 = scales[lVar33 + 1] * fVar39 + 12582912.0;
          fVar47 = scales[lVar33 + 2] * fVar39 + 12582912.0;
          fVar48 = scales[lVar33 + 3] * fVar39 + 12582912.0;
          uVar28 = SUB42(fVar42,0) & 0xff;
          uVar13 = SUB42(fVar46,0) & 0xff;
          uVar14 = SUB42(fVar47,0) & 0xff;
          uVar17 = SUB42(fVar48,0) & 0xff;
          bVar3 = (((uint)fVar42 & 0xff) != 0) * (uVar28 < 0x100) * SUB41(fVar42,0) -
                  (0xff < uVar28);
          bVar4 = (((uint)fVar46 & 0xff) != 0) * (uVar13 < 0x100) * SUB41(fVar46,0) -
                  (0xff < uVar13);
          bVar5 = (((uint)fVar47 & 0xff) != 0) * (uVar14 < 0x100) * SUB41(fVar47,0) -
                  (0xff < uVar14);
          bVar6 = (((uint)fVar48 & 0xff) != 0) * (uVar17 < 0x100) * SUB41(fVar48,0) -
                  (0xff < uVar17);
          *(uint *)(pbVar32->scales + lVar33) =
               CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                        CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                 CONCAT11((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                          (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3))))
          ;
          lVar33 = lVar33 + 4;
        } while (lVar33 != 0x10);
        fVar34 = fVar34 / 15.0;
        fVar39 = (float)(((uint)fVar34 & 0x7f800000) + 0x7800000);
        if ((uint)fVar34 < 0x38800000) {
          fVar39 = 2.0;
        }
        fVar39 = fVar39 + fVar34 * 5.192297e+33 * 7.70372e-34;
        uVar28 = (SUB42(fVar39,0) & 0xfff) + ((ushort)((uint)fVar39 >> 0xd) & 0x7c00);
        if (0x7f800000 < (uint)fVar34) {
          uVar28 = 0x7e00;
        }
      }
      auVar40 = _DAT_0014e5c0;
      y[uVar27].field_2.field_0.d = uVar28;
      auVar35 = _DAT_0014e740;
      if (fVar36 <= 0.0) {
        y[uVar27].field_2.field_0.dmin = 0;
        uVar26 = 0;
        auVar35 = _DAT_0014e740;
      }
      else {
        fVar39 = 15.0 / fVar36;
        lVar33 = 0;
        do {
          fVar34 = mins[lVar33] * fVar39 + 12582912.0;
          fVar42 = mins[lVar33 + 1] * fVar39 + 12582912.0;
          fVar46 = mins[lVar33 + 2] * fVar39 + 12582912.0;
          fVar47 = mins[lVar33 + 3] * fVar39 + 12582912.0;
          uVar28 = SUB42(fVar34,0) & 0xff;
          uVar13 = SUB42(fVar42,0) & 0xff;
          uVar14 = SUB42(fVar46,0) & 0xff;
          uVar17 = SUB42(fVar47,0) & 0xff;
          bVar3 = (((uint)fVar34 & 0xff) != 0) * (uVar28 < 0x100) * SUB41(fVar34,0) -
                  (0xff < uVar28);
          uVar38 = (ushort)bVar3;
          bVar4 = (((uint)fVar42 & 0xff) != 0) * (uVar13 < 0x100) * SUB41(fVar42,0) -
                  (0xff < uVar13);
          bVar5 = (((uint)fVar46 & 0xff) != 0) * (uVar14 < 0x100) * SUB41(fVar46,0) -
                  (0xff < uVar14);
          bVar6 = (((uint)fVar47 & 0xff) != 0) * (uVar17 < 0x100) * SUB41(fVar47,0) -
                  (0xff < uVar17);
          bVar7 = (((uint)fVar34 & 0xff) != 0) * (uVar28 < 0x100) * SUB41(fVar34,0) -
                  (0xff < uVar28);
          bVar8 = (((uint)fVar42 & 0xff) != 0) * (uVar13 < 0x100) * SUB41(fVar42,0) -
                  (0xff < uVar13);
          bVar9 = (((uint)fVar46 & 0xff) != 0) * (uVar14 < 0x100) * SUB41(fVar46,0) -
                  (0xff < uVar14);
          bVar10 = (((uint)fVar47 & 0xff) != 0) * (uVar17 < 0x100) * SUB41(fVar47,0) -
                   (0xff < uVar17);
          uVar28 = (ushort)bVar4;
          auVar41[1] = (bVar4 != 0) * (uVar28 < 0x100) * bVar4 - (0xff < uVar28);
          auVar41[0] = (bVar3 != 0) * (uVar38 < 0x100) * bVar3 - (0xff < uVar38);
          uVar13 = (ushort)bVar5;
          auVar41[2] = (bVar5 != 0) * (uVar13 < 0x100) * bVar5 - (0xff < uVar13);
          uVar14 = (ushort)bVar6;
          auVar41[3] = (bVar6 != 0) * (uVar14 < 0x100) * bVar6 - (0xff < uVar14);
          uVar17 = (ushort)bVar7;
          auVar41[4] = (bVar7 != 0) * (uVar17 < 0x100) * bVar7 - (0xff < uVar17);
          uVar16 = (ushort)bVar8;
          auVar41[5] = (bVar8 != 0) * (uVar16 < 0x100) * bVar8 - (0xff < uVar16);
          uVar18 = (ushort)bVar9;
          auVar41[6] = (bVar9 != 0) * (uVar18 < 0x100) * bVar9 - (0xff < uVar18);
          uVar19 = (ushort)bVar10;
          auVar41[7] = (bVar10 != 0) * (uVar19 < 0x100) * bVar10 - (0xff < uVar19);
          auVar41[8] = (bVar3 != 0) * (uVar38 < 0x100) * bVar3 - (0xff < uVar38);
          auVar41[9] = (bVar4 != 0) * (uVar28 < 0x100) * bVar4 - (0xff < uVar28);
          auVar41[10] = (bVar5 != 0) * (uVar13 < 0x100) * bVar5 - (0xff < uVar13);
          auVar41[0xb] = (bVar6 != 0) * (uVar14 < 0x100) * bVar6 - (0xff < uVar14);
          auVar41[0xc] = (bVar7 != 0) * (uVar17 < 0x100) * bVar7 - (0xff < uVar17);
          auVar41[0xd] = (bVar8 != 0) * (uVar16 < 0x100) * bVar8 - (0xff < uVar16);
          auVar41[0xe] = (bVar9 != 0) * (uVar18 < 0x100) * bVar9 - (0xff < uVar18);
          auVar41[0xf] = (bVar10 != 0) * (uVar19 < 0x100) * bVar10 - (0xff < uVar19);
          auVar41 = psllw(auVar41,4);
          *(uint *)(pbVar32->scales + lVar33) =
               auVar41._0_4_ & auVar40._0_4_ | *(uint *)(pbVar32->scales + lVar33);
          lVar33 = lVar33 + 4;
        } while (lVar33 != 0x10);
        fVar36 = fVar36 / 15.0;
        fVar39 = (float)(((uint)fVar36 & 0x7f800000) + 0x7800000);
        if ((uint)fVar36 < 0x38800000) {
          fVar39 = 2.0;
        }
        fVar39 = fVar39 + fVar36 * 5.192297e+33 * 7.70372e-34;
        uVar26 = (ulong)(((uint)fVar39 & 0xfff) + ((uint)fVar39 >> 0xd & 0x7c00));
        if (0x7f800000 < (uint)fVar36) {
          uVar26 = 0x7e00;
        }
        y[uVar27].field_2.field_0.dmin = (ggml_half)uVar26;
        uVar28 = (pbVar1->field_2).field_0.d;
      }
      auVar22 = _DAT_0014e770;
      auVar41 = _DAT_0014e760;
      fVar39 = ggml_table_f32_f16[uVar28];
      puVar31 = L;
      lVar33 = 0;
      pfVar30 = x;
      do {
        auVar37._0_4_ = (float)(pbVar1->scales[lVar33] & 0xf) * fVar39;
        if ((auVar37._0_4_ != 0.0) || (NAN(auVar37._0_4_))) {
          fVar34 = (float)(pbVar1->scales[lVar33] >> 4) * ggml_table_f32_f16[uVar26];
          auVar37._4_4_ = auVar37._0_4_;
          auVar37._8_4_ = auVar37._0_4_;
          auVar37._12_4_ = auVar37._0_4_;
          lVar29 = 0;
          do {
            pfVar2 = pfVar30 + lVar29;
            auVar50._0_4_ = *pfVar2 + fVar34;
            auVar50._4_4_ = pfVar2[1] + fVar34;
            auVar50._8_4_ = pfVar2[2] + fVar34;
            auVar50._12_4_ = pfVar2[3] + fVar34;
            auVar43 = divps(auVar50,auVar37);
            fVar36 = auVar43._0_4_ + 12582912.0;
            fVar42 = auVar43._4_4_ + 12582912.0;
            auVar44._0_8_ = CONCAT44(fVar42,fVar36) & 0x7fffff007fffff;
            auVar44._8_4_ = (uint)(auVar43._8_4_ + 12582912.0) & 0x7fffff;
            auVar44._12_4_ = (uint)(auVar43._12_4_ + 12582912.0) & 0x7fffff;
            auVar49._0_4_ = -(uint)((int)((uint)fVar36 & 0x7fffff) < auVar35._0_4_);
            auVar49._4_4_ = -(uint)((int)((uint)fVar42 & 0x7fffff) < auVar35._4_4_);
            auVar49._8_4_ = -(uint)((int)auVar44._8_4_ < auVar35._8_4_);
            auVar49._12_4_ = -(uint)((int)auVar44._12_4_ < auVar35._12_4_);
            auVar50 = ~auVar49 & auVar35 | auVar44 & auVar49;
            auVar45._0_4_ = -(uint)(0x400000 < auVar50._0_4_);
            auVar45._4_4_ = -(uint)(0x400000 < auVar50._4_4_);
            auVar45._8_4_ = -(uint)(0x400000 < auVar50._8_4_);
            auVar45._12_4_ = -(uint)(0x400000 < auVar50._12_4_);
            auVar43._8_4_ = 0xff;
            auVar43._0_8_ = 0xff000000ff;
            auVar43._12_4_ = 0xff;
            auVar43 = auVar45 & auVar50 & auVar43;
            uVar28 = auVar43._0_2_;
            bVar3 = (uVar28 != 0) * (uVar28 < 0x100) * auVar43[0] - (0xff < uVar28);
            uVar28 = auVar43._4_2_;
            bVar4 = (uVar28 != 0) * (uVar28 < 0x100) * auVar43[4] - (0xff < uVar28);
            sVar15 = auVar43._8_2_;
            cVar11 = (0 < sVar15) * (sVar15 < 0x100) * auVar43[8] - (0xff < sVar15);
            sVar15 = auVar43._10_2_;
            sVar21 = CONCAT11((0 < sVar15) * (sVar15 < 0x100) * auVar43[10] - (0xff < sVar15),cVar11
                             );
            sVar15 = auVar43._12_2_;
            cVar12 = (0 < sVar15) * (sVar15 < 0x100) * auVar43[0xc] - (0xff < sVar15);
            sVar15 = auVar43._14_2_;
            sVar15 = (short)(CONCAT13((0 < sVar15) * (sVar15 < 0x100) * auVar43[0xe] -
                                      (0xff < sVar15),CONCAT12(cVar12,sVar21)) >> 0x10);
            *(uint *)(puVar31 + lVar29) =
                 CONCAT13((0 < sVar15) * (sVar15 < 0x100) * cVar12 - (0xff < sVar15),
                          CONCAT12((0 < sVar21) * (sVar21 < 0x100) * cVar11 - (0xff < sVar21),
                                   CONCAT11((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                            (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3))
                                  ));
            lVar29 = lVar29 + 4;
          } while (lVar29 != 0x10);
        }
        lVar33 = lVar33 + 1;
        puVar31 = puVar31 + 0x10;
        pfVar30 = pfVar30 + 0x10;
      } while (lVar33 != 0x10);
      uVar26 = 0;
      bVar23 = true;
      do {
        bVar24 = bVar23;
        lVar33 = -0x20;
        do {
          auVar35 = psllw(*(undefined1 (*) [16])(L + lVar33 + uVar26 + 0x40),2);
          auVar37 = psllw(*(undefined1 (*) [16])(L + lVar33 + uVar26 + 0x60),4);
          in_XMM1 = auVar37 & auVar40;
          auVar37 = psllw(*(undefined1 (*) [16])(L + lVar33 + uVar26 + 0x80),6);
          *(undefined1 (*) [16])(pbVar32->qs + lVar33 + (uVar26 >> 2) + 0x20) =
               auVar37 & auVar22 | in_XMM1 |
               auVar35 & auVar41 | *(undefined1 (*) [16])(L + lVar33 + uVar26 + 0x20);
          lVar33 = lVar33 + 0x10;
        } while (lVar33 != 0);
        uVar26 = 0x80;
        bVar23 = false;
      } while (bVar24);
      x = x + 0x100;
      uVar27 = uVar27 + 1;
      pbVar32 = pbVar32 + 1;
    } while (uVar27 != (uVar25 & 0x7fffffff));
  }
  return;
}

Assistant:

void quantize_row_q2_K_ref(const float * GGML_RESTRICT x, block_q2_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int nb = k / QK_K;

    uint8_t L[QK_K];
    uint8_t Laux[16];
    float   weights[16];
    float mins[QK_K/16];
    float scales[QK_K/16];

    const float q4scale = 15.f;

    for (int i = 0; i < nb; i++) {
        float max_scale = 0; // as we are deducting the min, scales are always positive
        float max_min = 0;
        for (int j = 0; j < QK_K/16; ++j) {
            for (int l = 0; l < 16; ++l) weights[l] = fabsf(x[16*j + l]);
            scales[j] = make_qkx2_quants(16, 3, x + 16*j, weights, L + 16*j, &mins[j], Laux, -0.5f, 0.1f, 15, true);
            float scale = scales[j];
            if (scale > max_scale) {
                max_scale = scale;
            }
            float min = mins[j];
            if (min > max_min) {
                max_min = min;
            }
        }

        if (max_scale > 0) {
            float iscale = q4scale/max_scale;
            for (int j = 0; j < QK_K/16; ++j) {
                int l = nearest_int(iscale*scales[j]);
                y[i].scales[j] = l;
            }
            y[i].d = GGML_FP32_TO_FP16(max_scale/q4scale);
        } else {
            for (int j = 0; j < QK_K/16; ++j) y[i].scales[j] = 0;
            y[i].d = GGML_FP32_TO_FP16(0.f);
        }
        if (max_min > 0) {
            float iscale = q4scale/max_min;
            for (int j = 0; j < QK_K/16; ++j) {
                int l = nearest_int(iscale*mins[j]);
                y[i].scales[j] |= (l << 4);
            }
            y[i].dmin = GGML_FP32_TO_FP16(max_min/q4scale);
        } else {
            y[i].dmin = GGML_FP32_TO_FP16(0.f);
        }
        for (int j = 0; j < QK_K/16; ++j) {
            const float d = GGML_FP16_TO_FP32(y[i].d) * (y[i].scales[j] & 0xF);
            if (!d) continue;
            const float dm = GGML_FP16_TO_FP32(y[i].dmin) * (y[i].scales[j] >> 4);
            for (int ii = 0; ii < 16; ++ii) {
                int l = nearest_int((x[16*j + ii] + dm)/d);
                l = MAX(0, MIN(3, l));
                L[16*j + ii] = l;
            }
        }

        for (int j = 0; j < QK_K; j += 128) {
            for (int l = 0; l < 32; ++l) {
                y[i].qs[j/4 + l] = L[j + l] | (L[j + l + 32] << 2) | (L[j + l + 64] << 4) | (L[j + l + 96] << 6);
            }
        }

        x += QK_K;
    }
}